

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O0

void errmsg(char *m)

{
  ssize_t sVar1;
  ssize_t written;
  size_t s;
  char *m_local;
  
  written = strlen(m);
  s = (size_t)m;
  while ((written != 0 && (sVar1 = write(2,(void *)s,written), 0 < sVar1))) {
    s = sVar1 + s;
    written = written - sVar1;
  }
  return;
}

Assistant:

static void
errmsg(const char *m)
{
	size_t s = strlen(m);
	ssize_t written;

	while (s > 0) {
		written = write(2, m, s);
		if (written <= 0)
			return;
		m += written;
		s -= written;
	}
}